

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_nvector_manyvector.c
# Opt level: O3

void set_element(N_Vector X,sunindextype i,sunrealtype val)

{
  long *plVar1;
  long *plVar2;
  long lVar3;
  sunrealtype *psVar4;
  
  plVar1 = (long *)N_VGetSubvector_ManyVector(X,0);
  plVar2 = (long *)N_VGetSubvector_ManyVector(X,1);
  lVar3 = N_VGetLength(plVar1);
  if (i < lVar3) {
    psVar4 = (sunrealtype *)(i * 8 + *(long *)(*plVar1 + 0x10));
  }
  else {
    psVar4 = (sunrealtype *)((i - lVar3) * 8 + *(long *)(*plVar2 + 0x10));
  }
  *psVar4 = val;
  return;
}

Assistant:

void set_element(N_Vector X, sunindextype i, sunrealtype val)
{
  N_Vector Xsub[2];
  sunindextype x0len;

  Xsub[0] = N_VGetSubvector_ManyVector(X, 0);
  Xsub[1] = N_VGetSubvector_ManyVector(X, 1);
  x0len   = N_VGetLength(Xsub[0]);

  /* set i-th element of data array (in appropriate subvector) */
  if (i < x0len) { NV_Ith_S(Xsub[0], i) = val; }
  else { NV_Ith_S(Xsub[1], i - x0len) = val; }
}